

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

double __thiscall
chrono::fea::ChElementBeamANCF_3333::GetVonMissesStress
          (ChElementBeamANCF_3333 *this,double xi,double eta,double zeta)

{
  double *pdVar1;
  plain_array<double,_36,_1,_32> *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChMaterialBeamANCF *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar7 [16];
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  double *pdVar16;
  Index row;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  double dVar31;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ChMatrixNMc<double,_3,_3> F;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNM<double,_6,_6> D;
  ChMatrixNM<double,_3,_3> SPK2;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  ChMatrix33<double> S;
  ChMatrix33<double> J_0xi;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  Matrix<double,_3,_3,_0,_3,_3> local_4d0;
  double local_480 [6];
  undefined1 local_450 [16];
  ChMatrixNM<double,_6,_6> local_440;
  undefined1 local_310 [48];
  double adStack_2e0 [3];
  undefined1 local_2c8 [32];
  double adStack_2a8 [6];
  MatrixNx3c *local_278;
  Matrix<double,_3,_3,_1,_3,_3> *local_270;
  double local_268;
  Matrix<double,_3,_3,_0,_3,_3> *local_1f0;
  undefined1 *local_1e8;
  Matrix<double,_3,_3,_0,_3,_3> *local_1e0;
  double local_1d0;
  MatrixNx3c local_1c0;
  ChMatrix33<double> local_e0;
  Matrix<double,_3,_3,_1,_3,_3> local_98;
  
  Calc_Sxi_D(this,&local_1c0,xi,eta,zeta);
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>(&local_98,&this->m_ebar0,&local_1c0);
  local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_1c0;
  local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_98;
  local_2c8._0_8_ = &local_1c0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_2c8 + 8),
        (SrcXprType *)
        (local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array + 1),(assign_op<double,_double> *)&local_440);
  pdVar16 = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array + 8;
  local_278 = (MatrixNx3c *)local_2c8._0_8_;
  local_270 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_2c8 + 8);
  local_268 = 1.48219693752374e-323;
  auVar20 = *(undefined1 (*) [16])
             (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->m_storage
             ).m_data.array;
  auVar3 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->m_storage
             ).m_data.array + 2);
  auVar21 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->
              m_storage).m_data.array + 4);
  auVar22 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->
              m_storage).m_data.array + 6);
  auVar32 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->
              m_storage).m_data.array + 9);
  auVar35 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->
              m_storage).m_data.array + 0x12);
  auVar43 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->
              m_storage).m_data.array + 0xb);
  auVar45 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->
              m_storage).m_data.array + 0x14);
  auVar48 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->
              m_storage).m_data.array + 0xd);
  auVar4 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->m_storage
             ).m_data.array + 0x16);
  auVar5 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->m_storage
             ).m_data.array + 0xf);
  auVar6 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->m_storage
             ).m_data.array + 0x18);
  dVar23 = (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->m_storage).
           m_data.array[8];
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->m_storage).
       m_data.array[0x11];
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_2c8._0_8_)->m_storage).
       m_data.array[0x1a];
  lVar15 = 7;
  do {
    dVar31 = adStack_2e0[lVar15 + -3];
    auVar57._8_8_ = dVar31;
    auVar57._0_8_ = dVar31;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = adStack_2e0[lVar15];
    auVar17 = vmovddup_avx512vl(auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = adStack_2a8[lVar15 + -4];
    auVar18 = vmovddup_avx512vl(auVar18);
    lVar15 = lVar15 + 1;
    auVar19 = vmulpd_avx512vl(auVar20,auVar57);
    auVar19 = vfmadd231pd_avx512vl(auVar19,auVar32,auVar17);
    auVar19 = vfmadd231pd_avx512vl(auVar19,auVar35,auVar18);
    *(undefined1 (*) [16])((plain_array<double,_36,_1,_32> *)(pdVar16 + -8))->array = auVar19;
    auVar19 = vmulpd_avx512vl(auVar3,auVar57);
    auVar19 = vfmadd231pd_avx512vl(auVar19,auVar43,auVar17);
    auVar19 = vfmadd231pd_avx512vl(auVar19,auVar45,auVar18);
    *(undefined1 (*) [16])(pdVar16 + -6) = auVar19;
    auVar19 = vmulpd_avx512vl(auVar21,auVar57);
    auVar19 = vfmadd231pd_avx512vl(auVar19,auVar48,auVar17);
    auVar19 = vfmadd231pd_avx512vl(auVar19,auVar4,auVar18);
    *(undefined1 (*) [16])(pdVar16 + -4) = auVar19;
    auVar19 = vmulpd_avx512vl(auVar22,auVar57);
    auVar19 = vfmadd231pd_avx512vl(auVar19,auVar5,auVar17);
    auVar19 = vfmadd231pd_avx512vl(auVar19,auVar6,auVar18);
    auVar18 = vmulsd_avx512f(auVar56,auVar18);
    *(undefined1 (*) [16])(pdVar16 + -2) = auVar19;
    auVar17 = vmulsd_avx512f(auVar55,auVar17);
    auVar17 = vaddsd_avx512f(auVar17,auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar23 * dVar31;
    auVar17 = vaddsd_avx512f(auVar19,auVar17);
    *pdVar16 = auVar17._0_8_;
    pdVar16 = pdVar16 + 9;
  } while (lVar15 != 10);
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [0];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[1] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [1];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[2] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [2];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[3] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [3];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[4] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [4];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[5] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [5];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[6] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [6];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[7] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [7];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[8] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [8];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[9] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [9];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[10]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[10];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xb]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xb];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xc]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xc];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xd]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xd];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xe]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xe];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xf]
       = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xf];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x10] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x10];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x11] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x11];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x12] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x12];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x13] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x13];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x14] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x14];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x15] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x15];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x16] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x16];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x17] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x17];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x18] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x18];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x19] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x19];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x1a] = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x1a];
  CalcCoordMatrix(this,(Matrix3xN *)local_2c8);
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>(&local_4d0,(Matrix3xN *)local_2c8,&local_1c0);
  auVar22._8_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar22._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar20 = vunpcklpd_avx(auVar22,auVar43);
  auVar32._0_8_ =
       auVar20._0_8_ * auVar20._0_8_ +
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] +
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1];
  auVar32._8_8_ =
       auVar20._8_8_ * auVar20._8_8_ +
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar20._8_8_ = 0xbff0000000000000;
  auVar20._0_8_ = 0xbff0000000000000;
  auVar20 = vaddpd_avx512vl(auVar32,auVar20);
  auVar3._8_8_ = 0x3fe0000000000000;
  auVar3._0_8_ = 0x3fe0000000000000;
  local_4e0 = vmulpd_avx512vl(auVar20,auVar3);
  dVar23 = local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] *
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  auVar20 = vunpcklpd_avx(auVar45,auVar43);
  auVar21._8_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar21._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar20 = vmulpd_avx512vl(auVar20,auVar21);
  local_4f0._8_8_ =
       auVar20._8_8_ +
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  local_4f0._0_8_ =
       auVar20._0_8_ +
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar23;
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] *
        local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] +
        local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] *
        local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] +
        local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] *
        local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] + -1.0) * 0.5;
  if (this->m_damping_enabled == true) {
    local_450 = auVar48;
    CalcCoordDerivMatrix(this,(Matrix3xN *)&local_440);
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)local_310,
               (Matrix<double,_3,_9,_1,_3,_9> *)&local_440,&local_1c0);
    auVar14._8_8_ = local_310._24_8_;
    auVar14._0_8_ = local_310._16_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_310._40_8_;
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar53._8_8_ = 0;
    auVar53._0_8_ = adStack_2e0[2];
    auVar52._8_8_ = 0;
    auVar52._0_8_ =
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar20 = vunpcklpd_avx(auVar14,auVar50);
    auVar11._8_8_ =
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar11._0_8_ =
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar3 = vunpcklpd_avx(auVar11,auVar49);
    auVar36._0_8_ =
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] * (double)local_310._0_8_ +
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] * (double)local_310._8_8_ + auVar3._0_8_ * auVar20._0_8_;
    auVar36._8_8_ =
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] * (double)local_310._24_8_ +
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] * (double)local_310._32_8_ + auVar3._8_8_ * auVar20._8_8_;
    auVar46._8_8_ = this->m_Alpha;
    auVar46._0_8_ = this->m_Alpha;
    local_4e0 = vfmadd231pd_fma(local_4e0,auVar46,auVar36);
    auVar20 = vunpcklpd_avx(auVar53,auVar50);
    auVar6._8_8_ = local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2];
    auVar6._0_8_ = local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2];
    auVar21 = vmulpd_avx512vl(auVar20,auVar6);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_450._0_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ =
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] * adStack_2e0[0] +
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] * adStack_2e0[1] +
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] * adStack_2e0[2];
    auVar3 = vfmadd213sd_fma(auVar51,auVar46,auVar4);
    auVar20 = vunpcklpd_avx(auVar52,auVar49);
    auVar7._8_8_ = local_310._16_8_;
    auVar7._0_8_ = local_310._16_8_;
    auVar22 = vmulpd_avx512vl(auVar20,auVar7);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar23;
    auVar54._8_8_ = 0;
    auVar54._0_8_ =
         (double)local_310._24_8_ *
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         (double)local_310._32_8_ *
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         (double)local_310._40_8_ *
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] +
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] * adStack_2e0[0] +
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] * adStack_2e0[1] +
         adStack_2e0[2] *
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar20 = vfmadd213sd_fma(auVar54,auVar46,auVar5);
    auVar24._0_8_ =
         (double)local_310._0_8_ *
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         (double)local_310._8_8_ *
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] + auVar22._0_8_ +
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] * adStack_2e0[0] +
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] * adStack_2e0[1] + auVar21._0_8_;
    auVar24._8_8_ =
         (double)local_310._0_8_ *
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         (double)local_310._8_8_ *
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] + auVar22._8_8_ +
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] * (double)local_310._24_8_ +
         local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] * (double)local_310._32_8_ + auVar21._8_8_;
    local_500 = vunpcklpd_avx(auVar3,auVar20);
    local_4f0 = vfmadd231pd_fma(local_4f0,auVar46,auVar24);
  }
  else {
    local_500 = vunpcklpd_avx(auVar48,auVar35);
  }
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  ChMaterialBeamANCF::Get_D(this_00,&local_440);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pdVar16 = local_440.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array + 4;
  lVar15 = 0;
  do {
    pdVar1 = pdVar16 + -2;
    pdVar8 = pdVar16 + -1;
    dVar23 = *pdVar16;
    pdVar9 = pdVar16 + 1;
    ppVar2 = (plain_array<double,_36,_1,_32> *)(pdVar16 + -4);
    pdVar10 = pdVar16 + -3;
    pdVar16 = pdVar16 + 6;
    dVar23 = (double)local_4e0._0_8_ * ppVar2->array[0] +
             (double)local_500._0_8_ * *pdVar1 + (double)local_4f0._0_8_ * dVar23;
    dVar31 = (double)local_4e0._8_8_ * *pdVar10 +
             (double)local_500._8_8_ * *pdVar8 + (double)local_4f0._8_8_ * *pdVar9;
    auVar25._0_8_ = dVar23 + dVar31;
    auVar25._8_8_ = dVar23 + dVar31;
    dVar23 = (double)vmovlpd_avx(auVar25);
    local_480[lVar15] = dVar23;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 6);
  local_1e8 = local_310;
  auVar39._8_8_ = local_480[2];
  auVar39._0_8_ = local_480[2];
  auVar39._16_8_ = local_480[2];
  auVar39._24_8_ = local_480[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  local_310._0_8_ = local_480[0];
  local_310._32_8_ = local_480[1];
  auVar12._8_8_ = local_480[4];
  auVar12._0_8_ = local_480[3];
  auVar13._8_8_ = local_480[5];
  auVar13._0_8_ = local_480[4];
  auVar20 = vunpcklpd_avx(auVar12,auVar13);
  auVar39 = vblendpd_avx(ZEXT1632(auVar20),auVar39,8);
  unique0x0011ef00 = vpermpd_avx2(auVar39,0xc4);
  auVar20 = vshufpd_avx(auVar13,auVar13,1);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  local_310._8_8_ = auVar20._0_8_;
  local_310._16_8_ = auVar20._8_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar20 = vfmsub231sd_fma(auVar37,auVar47,auVar33);
  local_310._24_8_ = local_480[5];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar3 = vfmsub231sd_fma(auVar44,auVar26,auVar33);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar21 = vfmsub231sd_fma(auVar27,auVar47,auVar40);
  local_1d0 = auVar21._0_8_ *
              local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] +
              (auVar3._0_8_ *
               local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] -
              auVar20._0_8_ *
              local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3]);
  local_1f0 = &local_4d0;
  local_1e0 = &local_4d0;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (&local_e0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_1f0);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]) *
       (local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar20 = vfmadd231sd_fma(auVar28,auVar41,auVar41);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] -
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar20 = vfmadd213sd_fma(auVar34,auVar34,auVar20);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar3 = vfmadd231sd_fma(auVar42,auVar29,auVar29);
  auVar3 = vfmadd231sd_fma(auVar3,auVar38,auVar38);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar3._0_8_ * 3.0;
  auVar20 = vfmadd231sd_fma(auVar30,auVar20,ZEXT816(0x3fe0000000000000));
  if (auVar20._0_8_ < 0.0) {
    dVar23 = sqrt(auVar20._0_8_);
  }
  else {
    auVar20 = vsqrtsd_avx(auVar20,auVar20);
    dVar23 = auVar20._0_8_;
  }
  return dVar23;
}

Assistant:

double ChElementBeamANCF_3333::GetVonMissesStress(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    ChMatrixNM<double, 6, 6> D;
    GetMaterial()->Get_D(D);

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrixNM<double, 3, 3> SPK2;  // 2nd Piola Kirchhoff Stress tensor
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    // Convert from 2ndPK Stress to Cauchy Stress
    ChMatrix33<double> S = (F * SPK2 * F.transpose()) / F.determinant();
    double SVonMises =
        sqrt(0.5 * ((S(0, 0) - S(1, 1)) * (S(0, 0) - S(1, 1)) + (S(1, 1) - S(2, 2)) * (S(1, 1) - S(2, 2)) +
                    (S(2, 2) - S(0, 0)) * (S(2, 2) - S(0, 0))) +
             3 * (S(1, 2) * S(1, 2) + S(2, 0) * S(2, 0) + S(0, 1) * S(0, 1)));

    return (SVonMises);
}